

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<char_const(&)[6]>::operator!=
          (result *__return_storage_ptr__,expression_lhs<char_const(&)[6]> *this,
          basic_string_view<char,_std::char_traits<char>_> *rhs)

{
  lest *this_00;
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> *in_R8;
  allocator local_e1;
  string local_e0 [32];
  string local_c0;
  string local_a0 [32];
  string local_80 [32];
  basic_string_view<char,_std::char_traits<char>_> local_60;
  undefined1 local_50 [40];
  
  local_60.data_ = rhs->data_;
  local_60.size_ = rhs->size_;
  bVar1 = nonstd::sv_lite::operator!=(*(char **)this,&local_60);
  this_00 = *(lest **)this;
  std::__cxx11::string::string(local_80,"!=",&local_e1);
  std::__cxx11::string::string(local_e0,local_80);
  to_string<char[6],nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>>
            (&local_c0,this_00,(char (*) [6])local_e0,(string *)rhs,in_R8);
  std::__cxx11::string::string(local_a0,(string *)&local_c0);
  local_50[0] = bVar1;
  std::__cxx11::string::string((string *)(local_50 + 8),local_a0);
  result::result(__return_storage_ptr__,(result *)local_50);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

result operator!=( R const & rhs ) { return result( lhs != rhs, to_string( lhs, "!=", rhs ) ); }